

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseRightBoundary(DOMRangeImpl *this,DOMNode *root,int how)

{
  int iVar1;
  DOMNode *pDVar2;
  undefined4 extraout_var;
  DOMNode *pDVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *pDVar4;
  bool isFullySelected;
  DOMNode *n;
  
  pDVar2 = getSelectedNode(this,this->fEndContainer,(int)this->fEndOffset + -1);
  isFullySelected = pDVar2 != this->fEndContainer;
  if (pDVar2 == root) {
    pDVar2 = traverseNode(this,pDVar2,pDVar2 != this->fEndContainer,false,how);
    return pDVar2;
  }
  iVar1 = (*pDVar2->_vptr_DOMNode[5])(pDVar2);
  n = (DOMNode *)CONCAT44(extraout_var,iVar1);
  pDVar3 = traverseNode(this,n,false,false,how);
  while( true ) {
    pDVar4 = pDVar3;
    if (n == (DOMNode *)0x0) {
      return (DOMNode *)0x0;
    }
    while (pDVar2 != (DOMNode *)0x0) {
      iVar1 = (*pDVar2->_vptr_DOMNode[9])(pDVar2);
      pDVar3 = traverseNode(this,pDVar2,isFullySelected,false,how);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      isFullySelected = true;
      if (how != 3) {
        iVar1 = (*pDVar4->_vptr_DOMNode[7])(pDVar4);
        (*pDVar4->_vptr_DOMNode[0xe])(pDVar4,pDVar3,CONCAT44(extraout_var_01,iVar1));
        isFullySelected = true;
      }
    }
    if (n == root) break;
    iVar1 = (*n->_vptr_DOMNode[9])(n);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
    iVar1 = (*n->_vptr_DOMNode[5])(n);
    n = (DOMNode *)CONCAT44(extraout_var_03,iVar1);
    pDVar3 = traverseNode(this,n,false,false,how);
    if (how != 3) {
      (*pDVar3->_vptr_DOMNode[0x11])(pDVar3,pDVar4);
    }
  }
  return pDVar4;
}

Assistant:

DOMNode* DOMRangeImpl::traverseRightBoundary( DOMNode*root, int how )
{
    DOMNode*next = getSelectedNode( fEndContainer, (int)fEndOffset-1 );
    bool isFullySelected = ( next!=fEndContainer );

    if ( next==root )
        return traverseNode( next, isFullySelected, false, how );

    DOMNode*parent = next->getParentNode();
    DOMNode*clonedParent = traverseNode( parent, false, false, how );

    while( parent!=0 )
    {
        while( next!=0 )
        {
            DOMNode* prevSibling = next->getPreviousSibling();
            DOMNode* clonedChild =
                traverseNode( next, isFullySelected, false, how );
            if ( how!=DELETE_CONTENTS )
            {
                clonedParent->insertBefore(
                    clonedChild,
                    clonedParent->getFirstChild()
                );
            }
            isFullySelected = true;
            next = prevSibling;
        }
        if ( parent==root )
            return clonedParent;

        next = parent->getPreviousSibling();
        parent = parent->getParentNode();
        DOMNode* clonedGrandParent = traverseNode( parent, false, false, how );
        if ( how!=DELETE_CONTENTS )
            clonedGrandParent->appendChild( clonedParent );
        clonedParent = clonedGrandParent;

    }

    // should never occur
    return 0;
}